

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this,cmGeneratorTarget *target)

{
  unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_> *this_00;
  pointer pcVar1;
  cmOSXBundleGenerator *__ptr;
  _Head_base<0UL,_cmOSXBundleGenerator_*,_false> this_01;
  string local_40;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileUtilityTargetGenerator_00676e38;
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnUtility;
  this_01._M_head_impl = (cmOSXBundleGenerator *)operator_new(0x40);
  pcVar1 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName.
           _M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,
             pcVar1 + (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                      ConfigName._M_string_length);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_01._M_head_impl,target,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  __ptr = (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
          super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
          _M_t.
          super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
          .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = this_01._M_head_impl;
  if (__ptr != (cmOSXBundleGenerator *)0x0) {
    this_00 = &(this->super_cmMakefileTargetGenerator).OSXBundleGenerator;
    std::default_delete<cmOSXBundleGenerator>::operator()
              ((default_delete<cmOSXBundleGenerator> *)this_00,__ptr);
    this_01._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
         _M_t.
         super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
         super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  }
  (this_01._M_head_impl)->MacContentFolders =
       &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnUtility;
  this->OSXBundleGenerator =
    cm::make_unique<cmOSXBundleGenerator>(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}